

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_MockUnexpectedNthAdditionalCallFailure_TestShell::
~TEST_MockFailureTest_MockUnexpectedNthAdditionalCallFailure_TestShell
          (TEST_MockFailureTest_MockUnexpectedNthAdditionalCallFailure_TestShell *this)

{
  TEST_MockFailureTest_MockUnexpectedNthAdditionalCallFailure_TestShell *this_local;
  
  ~TEST_MockFailureTest_MockUnexpectedNthAdditionalCallFailure_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedNthAdditionalCallFailure)
{
    checkUnexpectedNthCallMessage(2, "2nd");
    checkUnexpectedNthCallMessage(3, "3rd");
    checkUnexpectedNthCallMessage(4, "4th");
    checkUnexpectedNthCallMessage(11, "11th");
    checkUnexpectedNthCallMessage(12, "12th");
    checkUnexpectedNthCallMessage(13, "13th");
    checkUnexpectedNthCallMessage(14, "14th");
    checkUnexpectedNthCallMessage(21, "21st");
    checkUnexpectedNthCallMessage(22, "22nd");
    checkUnexpectedNthCallMessage(23, "23rd");
}